

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  uint *puVar1;
  RABlock *block;
  long lVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  Error EVar6;
  RABlock *pRVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  uint uVar9;
  BaseNode *pBVar10;
  size_t siglen;
  uint uVar11;
  uint extraout_EDX;
  uchar *sig;
  ulong uVar12;
  RALocalAllocator *this_00;
  uchar *in_R8;
  uint uVar13;
  long lVar14;
  
  if (*(int *)(targets + 8) == 0) {
    return 3;
  }
  pBVar10 = *(BaseNode **)node;
  (this->_cc->super_BaseBuilder)._cursor = pBVar10;
  block = (RABlock *)**(undefined8 **)targets;
  uVar9 = *(uint *)(block + 0xb8);
  if ((ulong)uVar9 == 0xffffffff) {
    return 3;
  }
  if (uVar9 < *(uint *)&this->_pass->field_0xf0) {
    lVar14 = (ulong)uVar9 * 0x20 + *(long *)&this->_pass->_sharedAssignments;
    this_00 = this;
    EVar6 = allocInst(this,node);
    if (EVar6 != 0) {
      return EVar6;
    }
    node = *(InstNode **)(lVar14 + 0x18);
    if ((PhysToWorkMap *)node != (PhysToWorkMap *)0x0) {
      in_R8 = (uchar *)0x0;
      this_00 = this;
      EVar6 = switchToAssignment(this,(PhysToWorkMap *)node,(ZoneBitVector *)(lVar14 + 8),true,false
                                );
      if (EVar6 != 0) {
        return EVar6;
      }
    }
    uVar9 = *(uint *)(block + 0xb8);
    if ((ulong)uVar9 == 0xffffffff) {
      pRVar7 = block + 0xbc;
LAB_001254ba:
      EVar6 = spillScratchGpRegsBeforeEntry(this,*(RegMask *)pRVar7);
      if ((EVar6 == 0) &&
         ((*(long *)(lVar14 + 0x18) != 0 ||
          (EVar6 = BaseRAPass::setBlockEntryAssignment
                             (this->_pass,block,this->_block,&this->_curAssignment), EVar6 == 0))))
      {
        EVar6 = 0;
      }
      return EVar6;
    }
    pBVar10 = *(BaseNode **)block;
    if (uVar9 < *(uint *)(pBVar10 + 0xf0)) {
      pRVar7 = (RABlock *)((ulong)uVar9 * 0x20 + *(long *)(pBVar10 + 0xe8));
      goto LAB_001254ba;
    }
  }
  else {
    allocJumpTable();
    this_00 = this;
  }
  allocJumpTable();
  uVar9 = (uint)pBVar10;
  uVar11 = (uint)sig;
  if (uVar11 == 0xffffffff) {
    RAAssignment::assign();
LAB_00125591:
    RAAssignment::assign();
LAB_00125596:
    RAAssignment::assign();
LAB_0012559b:
    RAAssignment::assign();
LAB_001255a0:
    RAAssignment::assign();
LAB_001255a5:
    RAAssignment::assign();
LAB_001255aa:
    RAAssignment::assign();
  }
  else {
    if (*(uint *)((long)&this_00->_cc + 4) <= uVar11) goto LAB_00125591;
    lVar14 = *(long *)(this_00->_availableRegs)._masks._data;
    uVar8 = (ulong)sig & 0xffffffff;
    if (*(char *)(lVar14 + uVar8) != -1) goto LAB_00125596;
    if (0x1f < uVar9) goto LAB_0012559b;
    if (3 < (byte)node) goto LAB_001255a0;
    node = (InstNode *)((ulong)node & 0xff);
    if (*(int *)(*(long *)((this_00->_clobberedRegs)._masks._data + (long)node * 2) +
                ((ulong)pBVar10 & 0xffffffff) * 4) != -1) goto LAB_001255a5;
    lVar2 = *(long *)((this_00->_availableRegs)._masks._data + 2);
    uVar13 = 1 << ((byte)pBVar10 & 0x1f);
    if ((*(uint *)(lVar2 + (long)node * 4) >> (uVar9 & 0x1f) & 1) != 0) goto LAB_001255aa;
    if ((*(uint *)(lVar2 + 0x10 + (long)node * 4) & uVar13) == 0) {
      *(byte *)(lVar14 + uVar8) = (byte)pBVar10;
      *(uint *)(*(long *)((this_00->_clobberedRegs)._masks._data + (long)node * 2) +
               ((ulong)pBVar10 & 0xffffffff) * 4) = uVar11;
      lVar14 = *(long *)((this_00->_availableRegs)._masks._data + 2);
      puVar1 = (uint *)(lVar14 + (long)node * 4);
      *puVar1 = *puVar1 | uVar13;
      siglen = 0;
      if ((char)in_R8 != '\0') {
        siglen = (size_t)uVar13;
      }
      puVar1 = (uint *)(lVar14 + 0x10 + (long)node * 4);
      *puVar1 = *puVar1 | (uint)siglen;
      EVar6 = RAAssignment::verify
                        ((RAAssignment *)this_00,(EVP_PKEY_CTX *)node,sig,siglen,in_R8,uVar8);
      return EVar6;
    }
  }
  RAAssignment::assign();
  if (extraout_EDX == 0xffffffff) {
    onSaveReg();
LAB_00125612:
    onSaveReg();
LAB_00125617:
    onSaveReg();
LAB_0012561c:
    onSaveReg();
  }
  else {
    if ((this_00->_curAssignment)._layout.workCount <= extraout_EDX) goto LAB_00125612;
    if ((this_00->_curAssignment)._workToPhysMap[extraout_EDX].physIds[0] != uVar9)
    goto LAB_00125617;
    if (0x1f < uVar9) goto LAB_0012561c;
    if ((byte)node < 4) {
      uVar8 = (ulong)node & 0xff;
      node = (InstNode *)(this_00->_curAssignment)._physToWorkIds._data[uVar8];
      if ((((PhysToWorkMap *)node)->assigned)._masks._data[uVar9] == extraout_EDX) {
        bVar5 = (byte)uVar9 & 0x1f;
        puVar1 = (((this_00->_curAssignment)._physToWorkMap)->dirty)._masks._data + uVar8;
        *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        EVar6 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this_00->_pass,(ulong)extraout_EDX,(ulong)uVar9,extraout_RAX);
        return EVar6;
      }
      goto LAB_00125626;
    }
  }
  onSaveReg();
LAB_00125626:
  onSaveReg();
  if ((((*(uint *)&this_00->_pass == (((PhysToWorkMap *)node)->assigned)._masks._data[0]) &&
       (*(uint *)((long)&this_00->_pass + 4) == (((PhysToWorkMap *)node)->assigned)._masks._data[1])
       ) && (uVar9 = *(uint *)&this_00->_cc,
            uVar9 == (((PhysToWorkMap *)node)->assigned)._masks._data[2])) &&
     ((uVar11 = *(uint *)((long)&this_00->_cc + 4),
      uVar11 == (((PhysToWorkMap *)node)->assigned)._masks._data[3] &&
      (this_00->_archTraits == *(ArchTraits **)(((PhysToWorkMap *)node)->dirty)._masks._data)))) {
    if (uVar9 != 0) {
      lVar14 = 0;
      do {
        if (*(int *)(*(long *)((this_00->_availableRegs)._masks._data + 2) + 0x20 + lVar14 * 4) !=
            *(int *)(*(long *)((PhysToWorkMap *)node)->workIds + 0x20 + lVar14 * 4)) {
          return 0;
        }
        lVar14 = lVar14 + 1;
      } while (uVar9 != (uint)lVar14);
    }
    if (uVar11 != 0) {
      lVar14 = 0;
      do {
        if (*(char *)(*(long *)(this_00->_availableRegs)._masks._data + lVar14) !=
            *(char *)(*(long *)((((PhysToWorkMap *)node)->dirty)._masks._data + 2) + lVar14)) {
          return 0;
        }
        lVar14 = lVar14 + 1;
      } while (uVar11 != (uint)lVar14);
    }
    piVar3 = *(int **)((this_00->_availableRegs)._masks._data + 2);
    piVar4 = *(int **)((PhysToWorkMap *)node)->workIds;
    if (*piVar3 == *piVar4) {
      uVar8 = 0xffffffffffffffff;
      do {
        if (uVar8 == 2) {
          uVar12 = 3;
          break;
        }
        lVar14 = uVar8 + 2;
        uVar12 = uVar8 + 1;
        lVar2 = uVar8 + 2;
        uVar8 = uVar12;
      } while (piVar3[lVar14] == piVar4[lVar2]);
      if ((2 < uVar12) && (piVar3[4] == piVar4[4])) {
        uVar8 = 0;
        do {
          uVar12 = uVar8;
          if (uVar12 == 3) {
            uVar12 = 3;
            break;
          }
          uVar8 = uVar12 + 1;
        } while (piVar3[uVar12 + 5] == piVar4[uVar12 + 5]);
        return (Error)CONCAT71((int7)((ulong)piVar3 >> 8),2 < uVar12);
      }
    }
  }
  return 0;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}